

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Animator_Interrupt_proc(Am_Object *interp,Am_Value *new_value)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Value_List *pAVar5;
  Am_Wrapper *value;
  Am_Object local_70;
  Am_Value_List local_68;
  int local_54;
  undefined1 local_50 [4];
  int curr_phase;
  Am_Value_List values;
  Am_Object local_28;
  Am_Value *local_20;
  Am_Value *curr_value;
  Am_Value *new_value_local;
  Am_Object *interp_local;
  
  curr_value = new_value;
  new_value_local = (Am_Value *)interp;
  pAVar4 = Am_Object::Get(interp,0xf9,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
  if (bVar1) {
    local_20 = Am_Object::Get(interp,0x169,0);
    Am_Object::Am_Object(&local_28,interp);
    Am_Abort_Animator(&local_28);
    Am_Object::~Am_Object(&local_28);
    bVar1 = Am_Value::operator!=(local_20,curr_value);
    if (bVar1) {
      Am_Object::Am_Object((Am_Object *)&values.item,interp);
      Am_Start_Animator((Am_Object *)&values.item,local_20,curr_value);
      Am_Object::~Am_Object((Am_Object *)&values.item);
    }
  }
  else {
    Am_Value_List::Am_Value_List((Am_Value_List *)local_50);
    pAVar4 = Am_Object::Get(interp,0xfa,0);
    Am_Value_List::operator=((Am_Value_List *)local_50,pAVar4);
    pAVar4 = Am_Object::Get(interp,0xfb,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    local_54 = iVar3;
    if ((iVar3 < 0) ||
       (uVar2 = Am_Value_List::Length((Am_Value_List *)local_50), (int)(uVar2 - 1) <= iVar3)) {
      Am_Value_List::Am_Value_List(&local_68);
      pAVar4 = Am_Object::Get(interp,0x181,0);
      pAVar5 = Am_Value_List::Add(&local_68,pAVar4,Am_TAIL,true);
      pAVar4 = Am_Object::Get(interp,0x182,0);
      pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
      Am_Value_List::operator=((Am_Value_List *)local_50,pAVar5);
      Am_Value_List::~Am_Value_List(&local_68);
      local_54 = 0;
      Am_Object::Set(interp,0xfb,0,0);
    }
    Am_Value_List::Add((Am_Value_List *)local_50,curr_value,Am_TAIL,true);
    value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_50);
    Am_Object::Set(interp,0xfa,value,0);
    Am_Object::Am_Object(&local_70,interp);
    Am_Set_Animated_Slots(&local_70);
    Am_Object::~Am_Object(&local_70);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Anim_Update_Method, void, Am_Animator_Interrupt,
                 (Am_Object interp, const Am_Value &new_value))
{
  if ((bool)interp.Get(Am_INTERRUPTIBLE)) {
    const Am_Value& curr_value = interp.Get(Am_VALUE);
    Am_INTER_TRACE_PRINT(interp, "Animator Interrupt of "
                                     << interp << "; restarting from value "
                                     << curr_value << " towards new value "
                                     << new_value);
    Am_Abort_Animator(interp);

    if (curr_value != new_value)
      Am_Start_Animator(interp, curr_value, new_value);
  } else {
    Am_INTER_TRACE_PRINT(
        interp, "Animator Interrupt of "
                    << interp << "(running uninterrupted); got new value "
                    << new_value);

    Am_Value_List values;
    values = interp.Get(Am_VALUES);
    int curr_phase = interp.Get(Am_CURRENT_PHASE);

    if (curr_phase < 0 || curr_phase >= ((int)values.Length()) - 1) {
      // then curr_phase and values are not currently in use -- initialize them
      values = Am_Value_List()
                   .Add(interp.Get(Am_VALUE_1))
                   .Add(interp.Get(Am_VALUE_2));
      curr_phase = 0;
      interp.Set(Am_CURRENT_PHASE, curr_phase);
    }

    values.Add(new_value);
    interp.Set(Am_VALUES, values);

    Am_Set_Animated_Slots(interp);
  }

  return;
}